

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O3

void __thiscall depspawn::internal::TaskPool::~TaskPool(TaskPool *this)

{
  _Manager_type p_Var1;
  bool bVar2;
  
  do {
    do {
      bVar2 = try_run(this);
    } while (bVar2);
  } while ((this->busy_threads_).super___atomic_base<int>._M_i != 0);
  this->finish_ = true;
  do {
    do {
    } while ((this->thread_pool_).ready_ != false);
  } while ((this->thread_pool_).count_ != 0);
  p_Var1 = (this->idle_func_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->idle_func_,(_Any_data *)&this->idle_func_,__destroy_functor);
  }
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::~LinkedListPool
            (&this->task_pool_);
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::~queue(&this->hp_queue_);
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::~queue(&this->queue_);
  ThreadPool::~ThreadPool(&this->thread_pool_);
  return;
}

Assistant:

~TaskPool()
  {
    wait(false);
  }